

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
emplace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (QHash<unsigned_long_long,QSslServerPrivate::SocketData> *this,unsigned_long_long *key,
          Connection *args,Connection *args_1,shared_ptr<QTimer> *args_2)

{
  uint *puVar1;
  long in_FS_OFFSET;
  piter pVar2;
  Connection CStack_68;
  undefined1 local_60 [8];
  SocketData local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(uint **)this;
  if (puVar1 == (uint *)0x0) {
    local_58.readyReadConnection.d_ptr = (uint *)0x0;
LAB_00237742:
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::detach
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)this);
    pVar2 = (piter)emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                             (this,key,args,args_1,args_2);
    QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::~QHash
              ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)&local_58);
  }
  else {
    if (1 < *puVar1) {
      local_58.readyReadConnection.d_ptr = puVar1;
      if (*puVar1 != 0xffffffff) {
        LOCK();
        *puVar1 = *puVar1 + 1;
        UNLOCK();
      }
      goto LAB_00237742;
    }
    if (*(ulong *)(puVar1 + 2) < *(ulong *)(puVar1 + 4) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        pVar2 = (piter)emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
                                 (this,key,args,args_1,args_2);
        return (iterator)pVar2;
      }
      goto LAB_002377f8;
    }
    QMetaObject::Connection::Connection((Connection *)local_60,args);
    QMetaObject::Connection::Connection(&CStack_68,args_1);
    QSslServerPrivate::SocketData::SocketData
              (&local_58,(Connection)local_60,(Connection)&CStack_68,args_2);
    pVar2 = (piter)QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::
                   emplace_helper<QSslServerPrivate::SocketData>
                             ((QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *)this,key,
                              &local_58);
    QSslServerPrivate::SocketData::~SocketData(&local_58);
    QMetaObject::Connection::~Connection(&CStack_68);
    QMetaObject::Connection::~Connection((Connection *)local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (iterator)pVar2;
  }
LAB_002377f8:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }